

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall FxATan2::FxATan2(FxATan2 *this,FxExpression *y,FxExpression *x,FScriptPosition *pos)

{
  FScriptPosition *pos_local;
  FxExpression *x_local;
  FxExpression *y_local;
  FxATan2 *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_ATan2,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxATan2_00a0a990;
  this->yval = y;
  this->xval = x;
  return;
}

Assistant:

FxATan2::FxATan2(FxExpression *y, FxExpression *x, const FScriptPosition &pos)
: FxExpression(EFX_ATan2, pos)
{
	yval = y;
	xval = x;
}